

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.hpp
# Opt level: O0

void __thiscall gdsSREF::gdsSREF(gdsSREF *this)

{
  allocator<char> local_25 [20];
  allocator<char> local_11;
  gdsSREF *local_10;
  gdsSREF *this_local;
  
  this->plex = 0;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->name,"",&local_11);
  std::allocator<char>::~allocator(&local_11);
  std::bitset<16UL>::bitset(&this->sref_flags);
  this->reflection = false;
  this->scale = 1.0;
  this->angle = 0.0;
  this->xCor = 0;
  this->yCor = 0;
  this->propattr = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->propvalue,"",local_25);
  std::allocator<char>::~allocator(local_25);
  return;
}

Assistant:

~gdsSREF(){}